

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O3

void Tas_SetDefaultParams(Tas_Par_t *pPars)

{
  pPars->nJustTotal = 0;
  pPars->VarDecay = 0.95;
  pPars->nBTThis = 0;
  pPars->nBTThisNc = 0;
  pPars->nJustThis = 0;
  pPars->nBTTotal = 0;
  pPars->nBTLimit = 2000;
  pPars->nJustLimit = 2000;
  pPars->fUseMaxFF = 0;
  pPars->fVerbose = 1;
  pPars->VarInc = 1;
  pPars->fUseActive = 0;
  pPars->fUseHighest = 1;
  pPars->fUseLowest = 0;
  return;
}

Assistant:

void Tas_SetDefaultParams( Tas_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Tas_Par_t) );
    pPars->nBTLimit    =        2000;   // limit on the number of conflicts
    pPars->nJustLimit  =        2000;   // limit on the size of justification queue
    pPars->fUseActive  =           0;   // use node with the highest activity
    pPars->fUseHighest =           1;   // use node with the highest ID
    pPars->fUseLowest  =           0;   // use node with the lowest ID
    pPars->fUseMaxFF   =           0;   // use node with the largest fanin fanout
    pPars->fVerbose    =           1;   // print detailed statistics
    pPars->VarDecay    = (float)0.95;   // variable decay
    pPars->VarInc      =         1.0;   // variable increment
}